

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O2

int __thiscall
tchecker::assign_statement_t::clone
          (assign_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  lvalue_expression_t *__p;
  undefined4 extraout_var;
  assign_statement_t *this_00;
  shared_ptr<const_tchecker::expression_t> rvalue_clone;
  shared_ptr<const_tchecker::lvalue_expression_t> lvalue_clone;
  
  __p = (lvalue_expression_t *)
        (**(code **)((long)*(this->_lvalue).
                            super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 0x28))();
  std::__shared_ptr<tchecker::lvalue_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::lvalue_expression_t,void>
            ((__shared_ptr<tchecker::lvalue_expression_t_const,(__gnu_cxx::_Lock_policy)2> *)
             &lvalue_clone,__p);
  iVar1 = (*((this->_rvalue).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_expression_t[2])();
  std::__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::expression_t,void>
            ((__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2> *)&rvalue_clone,
             (expression_t *)CONCAT44(extraout_var,iVar1));
  this_00 = (assign_statement_t *)operator_new(0x28);
  assign_statement_t(this_00,&lvalue_clone,&rvalue_clone);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rvalue_clone.
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lvalue_clone.
              super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::assign_statement_t * assign_statement_t::clone() const
{
  std::shared_ptr<tchecker::lvalue_expression_t const> lvalue_clone{_lvalue->clone()};
  std::shared_ptr<tchecker::expression_t const> rvalue_clone{_rvalue->clone()};
  return new tchecker::assign_statement_t(lvalue_clone, rvalue_clone);
}